

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O1

int CVmObjString::getp_urlEncode(vm_val_t *retval,vm_val_t *self_val,char *str,uint *argc)

{
  byte bVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  undefined4 uVar3;
  vm_val_t *pvVar4;
  int iVar5;
  vm_obj_id_t vVar6;
  ulong uVar7;
  byte *pbVar8;
  byte bVar9;
  uint uVar10;
  size_t byte_size;
  byte bVar11;
  long lVar12;
  ulong uVar13;
  
  if (getp_urlEncode(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') {
    getp_urlEncode();
  }
  iVar5 = CVmObject::get_prop_check_argc(retval,argc,&getp_urlEncode::desc);
  pvVar4 = sp_;
  if (iVar5 == 0) {
    uVar3 = *(undefined4 *)&self_val->field_0x4;
    aVar2 = self_val->val;
    sp_ = sp_ + 1;
    pvVar4->typ = self_val->typ;
    *(undefined4 *)&pvVar4->field_0x4 = uVar3;
    pvVar4->val = aVar2;
    uVar13 = (ulong)*(ushort *)str;
    if (uVar13 == 0) {
      byte_size = 0;
    }
    else {
      uVar7 = 0;
      byte_size = 0;
      do {
        bVar9 = str[uVar7 + 2];
        if (((0x3f < bVar9 - 0x20) ||
            (lVar12 = 1, (0x8000000000002001U >> ((ulong)(bVar9 - 0x20) & 0x3f) & 1) == 0)) &&
           (lVar12 = (ulong)(0x19 < (byte)((bVar9 & 0xdf) + 0xbf)) * 2 + 1,
           (byte)(bVar9 - 0x30) < 10)) {
          lVar12 = 1;
        }
        byte_size = byte_size + lVar12;
        uVar7 = uVar7 + 1;
      } while (uVar13 != uVar7);
    }
    vVar6 = create(0,byte_size);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar6;
    if (uVar13 != 0) {
      pbVar8 = (byte *)(*(long *)((long)&G_obj_table_X.pages_[vVar6 >> 0xc][vVar6 & 0xfff].ptr_ + 8)
                       + 2);
      uVar7 = 0;
      do {
        bVar9 = str[uVar7 + 2];
        if ((bVar9 == 0x5f) || (bVar9 == 0x2d)) {
LAB_00289380:
          *pbVar8 = bVar9;
LAB_00289383:
          pbVar8 = pbVar8 + 1;
        }
        else {
          if (bVar9 == 0x20) {
            *pbVar8 = 0x2b;
            goto LAB_00289383;
          }
          if (((byte)(bVar9 - 0x30) < 10) || ((byte)((bVar9 & 0xdf) + 0xbf) < 0x1a))
          goto LAB_00289380;
          *pbVar8 = 0x25;
          bVar1 = bVar9 >> 4;
          if (bVar9 < 0xa0) {
            bVar11 = bVar1 | 0x30;
          }
          else {
            bVar11 = bVar1 + 0x37;
            if (5 < bVar1 - 10) {
              bVar11 = 0x3f;
            }
          }
          pbVar8[1] = bVar11;
          uVar10 = bVar9 & 0xf;
          if (uVar10 < 10) {
            bVar9 = (byte)uVar10 | 0x30;
          }
          else {
            bVar9 = (byte)uVar10 + 0x37;
            if (5 < uVar10 - 10) {
              bVar9 = 0x3f;
            }
          }
          pbVar8[2] = bVar9;
          pbVar8 = pbVar8 + 3;
        }
        uVar7 = uVar7 + 1;
      } while (uVar13 != uVar7);
    }
    sp_ = sp_ + -1;
  }
  return 1;
}

Assistant:

int CVmObjString::getp_urlEncode(VMG_ vm_val_t *retval,
                                 const vm_val_t *self_val,
                                 const char *str, uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* save my own value for gc protection */
    G_stk->push(self_val);

    /* get the length and buffer pointer */
    size_t len = vmb_get_len(str);
    str += VMB_LEN;

    /* scan the string and determine the size of the expansion */
    size_t outlen;
    const char *p;
    size_t rem;
    for (outlen = 0, p = str, rem = len ; rem != 0 ; ++p, --rem)
    {
        /* 
         *   if this is a space, letter, digit, or '-' or '_', it requires
         *   one byte in the output; otherwise it requires three bytes for
         *   the "%xx" sequence 
         */
        char c = *p;
        if (c == ' ' || c == '-' || c == '_'
            || (c >= 'a' && c <= 'z')
            || (c >= 'A' && c <= 'Z')
            || (c >= '0' && c <= '9'))
            outlen += 1;
        else
            outlen += 3;
    }

    /* allocate the return string */
    retval->set_obj(create(vmg_ FALSE, outlen));
    char *dst =
        ((CVmObjString *)vm_objp(vmg_ retval->val.obj))->cons_get_buf();

    /* build the return string */
    for (p = str, rem = len ; rem != 0 ; ++p, --rem)
    {
        /* translate this byte */
        char c = *p;
        if (c == ' ')
        {
            /* translate ' ' to '+' */
            *dst++ = '+';
        }
        else if (c == '-' || c == '_'
                 || (c >= 'a' && c <= 'z')
                 || (c >= 'A' && c <= 'Z')
                 || (c >= '0' && c <= '9'))
        {
            /* letter, digit, '-', '_' - leave unchanged */
            *dst++ = c;
        }
        else
        {
            /* translate anything else to a %xx sequence */
            *dst++ = '%';
            byte_to_xdigits(dst, (unsigned char)c);
            dst += 2;
        }
    }

    /* discard gc protection */
    G_stk->discard(1);

    /* done */
    return TRUE;
}